

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktDrawIndirectTest.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::Draw::anon_unknown_0::
IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported>::iterate
          (TestStatus *__return_storage_ptr__,
          IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported> *this)

{
  VkPrimitiveTopology VVar1;
  DrawType DVar2;
  DeviceInterface *pDVar3;
  VkCommandBuffer_s *pVVar4;
  VkOffset3D offset;
  qpTestResult code;
  undefined8 uVar5;
  bool bVar6;
  VkResult VVar7;
  int iVar8;
  int iVar9;
  TestContext *this_00;
  TestLog *log_00;
  TestError *pTVar10;
  Buffer *pBVar11;
  VkCommandBuffer_s **ppVVar12;
  VkDevice pVVar13;
  Allocator *pAVar14;
  void *pvVar15;
  reference src;
  VkDeviceSize offset_00;
  Handle<(vk::HandleType)18> *pHVar16;
  VkBuffer VVar17;
  PixelBufferAccess *pPVar18;
  Image *this_01;
  ConstPixelBufferAccess *reference;
  char *__s;
  SharedPtr<vkt::Draw::Buffer> *this_02;
  Move<vk::VkCommandBuffer_s_*> *this_03;
  float fVar19;
  float fVar20;
  allocator<char> local_3b1;
  string local_3b0;
  qpTestResult local_38c;
  void *pvStack_388;
  qpTestResult res;
  deInt32 local_380;
  undefined1 local_378 [8];
  ConstPixelBufferAccess renderedFrame;
  VkOffset3D zeroOffset;
  int local_32c;
  float xCoord;
  int x;
  float yCoord;
  int y;
  ReferenceImageInstancedCoordinates refInstancedCoords;
  deInt32 frameHeight;
  deInt32 frameWidth;
  undefined1 local_2e0 [8];
  Texture2D referenceFrame;
  undefined8 uStack_288;
  VkSubmitInfo submitInfo;
  uint local_22c;
  deUint32 drawNdx;
  Allocation local_208;
  Allocation local_1e8;
  VkDeviceMemory local_1c8;
  Allocation local_1c0;
  void *local_1a0;
  deUint8 *ptr;
  BufferCreateInfo local_190;
  undefined1 local_140 [24];
  VkDeviceSize dataSize;
  VkBuffer vertexBuffer;
  VkDeviceSize vertexBufferOffset;
  VkDrawIndexedIndirectCommand drawCmd_3 [3];
  VkDrawIndexedIndirectCommand drawCmd_2 [3];
  undefined1 local_88 [8];
  VkDrawIndirectCommand drawCmd_1 [3];
  VkDrawIndirectCommand drawCmd [3];
  VkQueue queue;
  TestLog *log;
  IndirectDrawInstanced<vkt::Draw::(anonymous_namespace)::FirtsInstanceNotSupported> *this_local;
  
  this_00 = Context::getTestContext
                      ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  log_00 = tcu::TestContext::getLog(this_00);
  drawCmd[2]._8_8_ =
       Context::getUniversalQueue
                 ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.m_context);
  if ((this->super_IndirectDraw).m_drawType == DRAW_TYPE_SEQUENTIAL) {
    VVar1 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_topology;
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      drawCmd_1[2].firstVertex = 3;
      drawCmd_1[2].firstInstance = 4;
      drawCmd[0].vertexCount = 2;
      drawCmd[0].instanceCount = FirtsInstanceNotSupported::getFirstInstance();
      drawCmd[0].firstVertex = 0xfffffffc;
      drawCmd[0].firstInstance = 0xfffffffe;
      drawCmd[1].vertexCount = 0xfffffff5;
      drawCmd[1].instanceCount = 0xfffffff7;
      drawCmd[1].firstVertex = 3;
      drawCmd[1].firstInstance = 4;
      drawCmd[2].vertexCount = 5;
      drawCmd[2].instanceCount = FirtsInstanceNotSupported::getFirstInstance();
      IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndirectCommand *)&drawCmd_1[2].firstVertex);
      IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndirectCommand *)&drawCmd[0].firstVertex);
      IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndirectCommand *)&drawCmd[1].firstVertex);
    }
    else {
      if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x218);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      local_88._0_4_ = 4;
      local_88._4_4_ = 4;
      drawCmd_1[0].vertexCount = 2;
      drawCmd_1[0].instanceCount = FirtsInstanceNotSupported::getFirstInstance();
      drawCmd_1[0].firstVertex = 0xfffffffc;
      drawCmd_1[0].firstInstance = 0xfffffffe;
      drawCmd_1[1].vertexCount = 0xfffffff5;
      drawCmd_1[1].instanceCount = 0xfffffff7;
      drawCmd_1[1].firstVertex = 4;
      drawCmd_1[1].firstInstance = 4;
      drawCmd_1[2].vertexCount = 6;
      drawCmd_1[2].instanceCount = FirtsInstanceNotSupported::getFirstInstance();
      IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndirectCommand *)local_88);
      IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndirectCommand *)&drawCmd_1[0].firstVertex);
      IndirectDraw::addCommand<vk::VkDrawIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndirectCommand *)&drawCmd_1[1].firstVertex);
    }
    (this->super_IndirectDraw).m_strideInBuffer = 0x20;
  }
  else if ((this->super_IndirectDraw).m_drawType == DRAW_TYPE_INDEXED) {
    VVar1 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_topology;
    if (VVar1 == VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST) {
      drawCmd_3[2].firstInstance = 3;
      drawCmd_2[0].indexCount = 2;
      drawCmd_2[0].instanceCount = 0xd;
      drawCmd_2[0].firstIndex = FirtsInstanceNotSupported::getFirstInstance();
      drawCmd_2[0].vertexOffset = -4;
      drawCmd_2[0].firstInstance = 0xfffffffe;
      drawCmd_2[1].indexCount = 0xfffffff5;
      drawCmd_2[1].instanceCount = 9;
      drawCmd_2[1].firstIndex = 0xfffffff9;
      drawCmd_2[1].vertexOffset = 3;
      drawCmd_2[1].firstInstance = 4;
      drawCmd_2[2].indexCount = 5;
      drawCmd_2[2].instanceCount = 0xd;
      drawCmd_2[2].firstIndex = FirtsInstanceNotSupported::getFirstInstance();
      IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
                (&this->super_IndirectDraw,
                 (VkDrawIndexedIndirectCommand *)&drawCmd_3[2].firstInstance);
      IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
                (&this->super_IndirectDraw,
                 (VkDrawIndexedIndirectCommand *)&drawCmd_2[0].vertexOffset);
      IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
                (&this->super_IndirectDraw,
                 (VkDrawIndexedIndirectCommand *)&drawCmd_2[1].vertexOffset);
    }
    else {
      if (VVar1 != VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x255);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      vertexBufferOffset._0_4_ = 4;
      vertexBufferOffset._4_4_ = 4;
      drawCmd_3[0].indexCount = 2;
      drawCmd_3[0].instanceCount = 0xd;
      drawCmd_3[0].firstIndex = FirtsInstanceNotSupported::getFirstInstance();
      drawCmd_3[0].vertexOffset = -4;
      drawCmd_3[0].firstInstance = 0xfffffffe;
      drawCmd_3[1].indexCount = 0xfffffff5;
      drawCmd_3[1].instanceCount = 9;
      drawCmd_3[1].firstIndex = 0xfffffff9;
      drawCmd_3[1].vertexOffset = 4;
      drawCmd_3[1].firstInstance = 4;
      drawCmd_3[2].indexCount = 6;
      drawCmd_3[2].instanceCount = 0xd;
      drawCmd_3[2].firstIndex = FirtsInstanceNotSupported::getFirstInstance();
      IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
                (&this->super_IndirectDraw,(VkDrawIndexedIndirectCommand *)&vertexBufferOffset);
      IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
                (&this->super_IndirectDraw,
                 (VkDrawIndexedIndirectCommand *)&drawCmd_3[0].vertexOffset);
      IndirectDraw::addCommand<vk::VkDrawIndexedIndirectCommand>
                (&this->super_IndirectDraw,
                 (VkDrawIndexedIndirectCommand *)&drawCmd_3[1].vertexOffset);
    }
    (this->super_IndirectDraw).m_strideInBuffer = 0x28;
  }
  (this->super_IndirectDraw).m_drawCount = 2;
  (this->super_IndirectDraw).m_offsetInBuffer = 8;
  DrawTestsBaseClass::beginRenderPass((DrawTestsBaseClass *)this);
  vertexBuffer.m_internal = 0;
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                      (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_vertexBuffer);
  dataSize = (VkDeviceSize)Draw::Buffer::object(pBVar11);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar3->_vptr_DeviceInterface[0x58])(pDVar3,*ppVVar12,0,1,&dataSize,&vertexBuffer);
  local_140._16_8_ =
       std::vector<char,_std::allocator<char>_>::size
                 (&(this->super_IndirectDraw).m_indirectBufferContents);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  pVVar13 = Context::getDevice((this->super_IndirectDraw).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  BufferCreateInfo::BufferCreateInfo
            (&local_190,local_140._16_8_ + (this->super_IndirectDraw).m_offsetInBuffer,0x100,
             VK_SHARING_MODE_EXCLUSIVE,0,(deUint32 *)0x0,0);
  pAVar14 = Context::getDefaultAllocator
                      ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  ptr._4_4_ = ::vk::MemoryRequirement::HostVisible.m_flags;
  Draw::Buffer::createAndAlloc
            ((Buffer *)local_140,pDVar3,pVVar13,&local_190.super_VkBufferCreateInfo,pAVar14,
             ::vk::MemoryRequirement::HostVisible);
  de::SharedPtr<vkt::Draw::Buffer>::operator=
            (&(this->super_IndirectDraw).m_indirectBuffer,(SharedPtr<vkt::Draw::Buffer> *)local_140)
  ;
  de::SharedPtr<vkt::Draw::Buffer>::~SharedPtr((SharedPtr<vkt::Draw::Buffer> *)local_140);
  BufferCreateInfo::~BufferCreateInfo(&local_190);
  this_02 = &(this->super_IndirectDraw).m_indirectBuffer;
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_1c0,pBVar11);
  pvVar15 = ::vk::Allocation::getHostPtr(&local_1c0);
  ::vk::Allocation::~Allocation(&local_1c0);
  local_1a0 = pvVar15;
  ::deMemcpy(pvVar15,&(this->super_IndirectDraw).m_junkData,
             (this->super_IndirectDraw).m_offsetInBuffer);
  pvVar15 = (void *)((long)local_1a0 + (this->super_IndirectDraw).m_offsetInBuffer);
  src = std::vector<char,_std::allocator<char>_>::operator[]
                  (&(this->super_IndirectDraw).m_indirectBufferContents,0);
  ::deMemcpy(pvVar15,src,local_140._16_8_);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  pVVar13 = Context::getDevice((this->super_IndirectDraw).super_DrawTestsBaseClass.
                               super_TestInstance.m_context);
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_1e8,pBVar11);
  local_1c8 = ::vk::Allocation::getMemory(&local_1e8);
  pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->(this_02);
  Draw::Buffer::getBoundMemory(&local_208,pBVar11);
  offset_00 = ::vk::Allocation::getOffset(&local_208);
  ::vk::flushMappedMemoryRange
            (pDVar3,pVVar13,local_1c8,offset_00,
             local_140._16_8_ + (this->super_IndirectDraw).m_offsetInBuffer);
  ::vk::Allocation::~Allocation(&local_208);
  ::vk::Allocation::~Allocation(&local_1e8);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                         super_RefBase<vk::VkCommandBuffer_s_*>);
  pVVar4 = *ppVVar12;
  pHVar16 = ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)18>_>::operator*
                      (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_pipeline.
                        super_RefBase<vk::Handle<(vk::HandleType)18>_>);
  (*pDVar3->_vptr_DeviceInterface[0x4c])(pDVar3,pVVar4,0,pHVar16->m_internal);
  if ((this->super_IndirectDraw).m_drawType == DRAW_TYPE_INDEXED) {
    pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
    ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                         (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                           super_RefBase<vk::VkCommandBuffer_s_*>);
    pVVar4 = *ppVVar12;
    pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                        (&(this->super_IndirectDraw).m_indexBuffer);
    VVar17 = Draw::Buffer::object(pBVar11);
    (*pDVar3->_vptr_DeviceInterface[0x57])(pDVar3,pVVar4,VVar17.m_internal,0,1);
  }
  if (((this->super_IndirectDraw).m_isMultiDrawEnabled == 0) ||
     ((this->super_IndirectDraw).m_drawIndirectMaxCount < (this->super_IndirectDraw).m_drawCount)) {
    for (local_22c = 0; local_22c < (this->super_IndirectDraw).m_drawCount;
        local_22c = local_22c + 1) {
      DVar2 = (this->super_IndirectDraw).m_drawType;
      if (DVar2 == DRAW_TYPE_SEQUENTIAL) {
        pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
        ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                               super_RefBase<vk::VkCommandBuffer_s_*>);
        pVVar4 = *ppVVar12;
        pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                            (&(this->super_IndirectDraw).m_indirectBuffer);
        VVar17 = Draw::Buffer::object(pBVar11);
        (*pDVar3->_vptr_DeviceInterface[0x5b])
                  (pDVar3,pVVar4,VVar17.m_internal,
                   (this->super_IndirectDraw).m_offsetInBuffer +
                   (ulong)(local_22c * (this->super_IndirectDraw).m_strideInBuffer),1,0);
      }
      else {
        if (DVar2 != DRAW_TYPE_INDEXED) {
          pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar10,"impossible",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                     ,0x29c);
          __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
        ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                             (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                               super_RefBase<vk::VkCommandBuffer_s_*>);
        pVVar4 = *ppVVar12;
        pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                            (&(this->super_IndirectDraw).m_indirectBuffer);
        submitInfo.pSignalSemaphores = (VkSemaphore *)Draw::Buffer::object(pBVar11);
        (*pDVar3->_vptr_DeviceInterface[0x5c])
                  (pDVar3,pVVar4,submitInfo.pSignalSemaphores,
                   (this->super_IndirectDraw).m_offsetInBuffer +
                   (ulong)(local_22c * (this->super_IndirectDraw).m_strideInBuffer),1);
      }
    }
  }
  else {
    DVar2 = (this->super_IndirectDraw).m_drawType;
    if (DVar2 == DRAW_TYPE_SEQUENTIAL) {
      pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
      ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                             super_RefBase<vk::VkCommandBuffer_s_*>);
      pVVar4 = *ppVVar12;
      pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                          (&(this->super_IndirectDraw).m_indirectBuffer);
      VVar17 = Draw::Buffer::object(pBVar11);
      (*pDVar3->_vptr_DeviceInterface[0x5b])
                (pDVar3,pVVar4,VVar17.m_internal,(this->super_IndirectDraw).m_offsetInBuffer,
                 (ulong)(this->super_IndirectDraw).m_drawCount,
                 (ulong)(this->super_IndirectDraw).m_strideInBuffer);
    }
    else {
      if (DVar2 != DRAW_TYPE_INDEXED) {
        pTVar10 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar10,"impossible",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                   ,0x28c);
        __cxa_throw(pTVar10,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
      ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                           (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer.
                             super_RefBase<vk::VkCommandBuffer_s_*>);
      pVVar4 = *ppVVar12;
      pBVar11 = de::SharedPtr<vkt::Draw::Buffer>::operator->
                          (&(this->super_IndirectDraw).m_indirectBuffer);
      VVar17 = Draw::Buffer::object(pBVar11);
      (*pDVar3->_vptr_DeviceInterface[0x5c])
                (pDVar3,pVVar4,VVar17.m_internal,(this->super_IndirectDraw).m_offsetInBuffer,
                 (ulong)(this->super_IndirectDraw).m_drawCount,
                 (ulong)(this->super_IndirectDraw).m_strideInBuffer);
    }
  }
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  this_03 = &(this->super_IndirectDraw).super_DrawTestsBaseClass.m_cmdBuffer;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar3->_vptr_DeviceInterface[0x76])(pDVar3,*ppVVar12);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  ppVVar12 = ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::operator*
                       (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  (*pDVar3->_vptr_DeviceInterface[0x4a])(pDVar3,*ppVVar12);
  submitInfo.commandBufferCount = 0;
  submitInfo._44_4_ = 0;
  submitInfo.pCommandBuffers = (VkCommandBuffer *)0x0;
  submitInfo.pWaitSemaphores = (VkSemaphore *)0x0;
  submitInfo.pNext = (void *)0x0;
  submitInfo.waitSemaphoreCount = 0;
  submitInfo._20_4_ = 0;
  submitInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  submitInfo._4_4_ = 0;
  submitInfo.signalSemaphoreCount = 0;
  submitInfo._60_4_ = 0;
  uStack_288 = 4;
  submitInfo.pWaitDstStageMask = (VkPipelineStageFlags *)0x1;
  submitInfo._40_8_ =
       ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::get
                 (&this_03->super_RefBase<vk::VkCommandBuffer_s_*>);
  uVar5 = drawCmd[2]._8_8_;
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  ::vk::Handle<(vk::HandleType)6>::Handle
            ((Handle<(vk::HandleType)6> *)&referenceFrame.m_view.m_levels,0);
  VVar7 = (*pDVar3->_vptr_DeviceInterface[2])(pDVar3,uVar5,1,&uStack_288);
  ::vk::checkResult(VVar7,"m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2af);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  VVar7 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,drawCmd[2]._8_8_);
  ::vk::checkResult(VVar7,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2b1);
  pDVar3 = (this->super_IndirectDraw).super_DrawTestsBaseClass.m_vk;
  VVar7 = (*pDVar3->_vptr_DeviceInterface[3])(pDVar3,drawCmd[2]._8_8_);
  ::vk::checkResult(VVar7,"m_vk.queueWaitIdle(queue)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/draw/vktDrawIndirectTest.cpp"
                    ,0x2b4);
  _frameHeight = ::vk::mapVkFormat((this->super_IndirectDraw).super_DrawTestsBaseClass.
                                   m_colorAttachmentFormat);
  tcu::Texture2D::Texture2D((Texture2D *)local_2e0,(TextureFormat *)&frameHeight,0x100,0x100);
  tcu::Texture2D::allocLevel((Texture2D *)local_2e0,0);
  iVar8 = tcu::Texture2D::getWidth((Texture2D *)local_2e0);
  iVar9 = tcu::Texture2D::getHeight((Texture2D *)local_2e0);
  pPVar18 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_2e0,0);
  tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&refInstancedCoords.bottom,0.0,0.0,0.0,1.0);
  tcu::clear(pPVar18,(Vec4 *)&refInstancedCoords.bottom);
  ReferenceImageInstancedCoordinates::ReferenceImageInstancedCoordinates
            ((ReferenceImageInstancedCoordinates *)&yCoord);
  for (x = 0; x < iVar9; x = x + 1) {
    fVar19 = (float)x / ((float)iVar9 * 0.5) - 1.0;
    for (local_32c = 0; local_32c < iVar8; local_32c = local_32c + 1) {
      fVar20 = (float)local_32c / ((float)iVar8 * 0.5) - 1.0;
      if ((((refInstancedCoords.top <= (double)fVar19) &&
           ((double)fVar19 <= refInstancedCoords.right)) && (_yCoord <= (double)fVar20)) &&
         ((double)fVar20 <= refInstancedCoords.left)) {
        pPVar18 = tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_2e0,0);
        tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&zeroOffset.z,0.0,0.0,1.0,1.0);
        tcu::PixelBufferAccess::setPixel(pPVar18,(Vec4 *)&zeroOffset.z,local_32c,x,0);
      }
    }
  }
  zeroOffset.x = 0;
  renderedFrame.m_data = (void *)0x0;
  this_01 = de::SharedPtr<vkt::Draw::Image>::operator->
                      (&(this->super_IndirectDraw).super_DrawTestsBaseClass.m_colorTargetImage);
  uVar5 = drawCmd[2]._8_8_;
  pAVar14 = Context::getDefaultAllocator
                      ((this->super_IndirectDraw).super_DrawTestsBaseClass.super_TestInstance.
                       m_context);
  local_380 = zeroOffset.x;
  pvStack_388 = renderedFrame.m_data;
  offset.z = zeroOffset.x;
  offset._0_8_ = renderedFrame.m_data;
  Draw::Image::readSurface
            ((ConstPixelBufferAccess *)local_378,this_01,(VkQueue)uVar5,pAVar14,
             VK_IMAGE_LAYOUT_GENERAL,offset,0x100,0x100,VK_IMAGE_ASPECT_COLOR_BIT,0,0);
  local_38c = QP_TEST_RESULT_PASS;
  reference = &tcu::TextureLevelPyramid::getLevel((TextureLevelPyramid *)local_2e0,0)->
               super_ConstPixelBufferAccess;
  bVar6 = tcu::fuzzyCompare(log_00,"Result","Image comparison result",reference,
                            (ConstPixelBufferAccess *)local_378,0.05,COMPARE_LOG_RESULT);
  if (!bVar6) {
    local_38c = QP_TEST_RESULT_FAIL;
  }
  code = local_38c;
  __s = qpGetTestResultName(local_38c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,__s,&local_3b1);
  tcu::TestStatus::TestStatus(__return_storage_ptr__,code,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  tcu::Texture2D::~Texture2D((Texture2D *)local_2e0);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus IndirectDrawInstanced<FirstInstanceSupport>::iterate (void)
{
	tcu::TestLog &log = m_context.getTestContext().getLog();
	const vk::VkQueue queue = m_context.getUniversalQueue();

	if (m_drawType == DRAW_TYPE_SEQUENTIAL)
	{
		switch (m_topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			{
				vk::VkDrawIndirectCommand drawCmd[] =
				{
					{
						3,											//vertexCount
						4,											//instanceCount
						2,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 }, // junk (stride)
					{
						3,											//vertexCount
						4,											//instanceCount
						5,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			{
				vk::VkDrawIndirectCommand drawCmd[] =
				{
					{
						4,											//vertexCount
						4,											//instanceCount
						2,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deUint32)-9 },
					{
						4,											//vertexCount
						4,											//instanceCount
						6,											//firstVertex
						FirstInstanceSupport::getFirstInstance()	//firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			default:
				TCU_FAIL("impossible");
				break;
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndirectCommand);
	}
	else if (m_drawType == DRAW_TYPE_INDEXED)
	{
		switch (m_topology)
		{
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST:
			{
				vk::VkDrawIndexedIndirectCommand drawCmd[] =
				{
					{
						3,											// indexCount
						4,											// instanceCount
						2,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 },	// junk (stride)
					{
						3,											// indexCount
						4,											// instanceCount
						5,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			case vk::VK_PRIMITIVE_TOPOLOGY_TRIANGLE_STRIP:
			{
				vk::VkDrawIndexedIndirectCommand drawCmd[] =
				{
					{
						4,											// indexCount
						4,											// instanceCount
						2,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					},
					{ (deUint32)-4, (deUint32)-2, (deUint32)-11, (deInt32)9, (deUint32)-7 },	// junk (stride)
					{
						4,											// indexCount
						4,											// instanceCount
						6,											// firstIndex
						VERTEX_OFFSET,								// vertexOffset
						FirstInstanceSupport::getFirstInstance()	// firstInstance
					}
				};
				addCommand(drawCmd[0]);
				addCommand(drawCmd[1]);
				addCommand(drawCmd[2]);
				break;
			}
			default:
				TCU_FAIL("impossible");
				break;
		}

		m_strideInBuffer = 2 * (deUint32)sizeof(vk::VkDrawIndexedIndirectCommand);
	}

	m_drawCount			= 2;
	m_offsetInBuffer	= sizeof(m_junkData);

	beginRenderPass();

	const vk::VkDeviceSize vertexBufferOffset = 0;
	const vk::VkBuffer vertexBuffer = m_vertexBuffer->object();

	m_vk.cmdBindVertexBuffers(*m_cmdBuffer, 0, 1, &vertexBuffer, &vertexBufferOffset);

	const vk::VkDeviceSize dataSize = m_indirectBufferContents.size();

	m_indirectBuffer = Buffer::createAndAlloc(	m_vk,
												m_context.getDevice(),
												BufferCreateInfo(dataSize + m_offsetInBuffer,
																 vk::VK_BUFFER_USAGE_INDIRECT_BUFFER_BIT),
												m_context.getDefaultAllocator(),
												vk::MemoryRequirement::HostVisible);

	deUint8* ptr = reinterpret_cast<deUint8*>(m_indirectBuffer->getBoundMemory().getHostPtr());

	deMemcpy(ptr, &m_junkData, static_cast<size_t>(m_offsetInBuffer));
	deMemcpy((ptr + m_offsetInBuffer), &m_indirectBufferContents[0], static_cast<size_t>(dataSize));

	vk::flushMappedMemoryRange(m_vk,
							   m_context.getDevice(),
							   m_indirectBuffer->getBoundMemory().getMemory(),
							   m_indirectBuffer->getBoundMemory().getOffset(),
							   dataSize + m_offsetInBuffer);

	m_vk.cmdBindPipeline(*m_cmdBuffer, vk::VK_PIPELINE_BIND_POINT_GRAPHICS, *m_pipeline);

	if (m_drawType == DRAW_TYPE_INDEXED)
	{
		m_vk.cmdBindIndexBuffer(*m_cmdBuffer, m_indexBuffer->object(), DE_NULL, vk::VK_INDEX_TYPE_UINT32);
	}

	if (m_isMultiDrawEnabled && m_drawCount <= m_drawIndirectMaxCount)
	{
		switch (m_drawType)
		{
			case DRAW_TYPE_SEQUENTIAL:
				m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			case DRAW_TYPE_INDEXED:
				m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer, m_drawCount, m_strideInBuffer);
				break;
			default:
				TCU_FAIL("impossible");
		}
	}
	else
	{
		for (deUint32 drawNdx = 0; drawNdx < m_drawCount; drawNdx++)
		{
			switch (m_drawType)
			{
				case DRAW_TYPE_SEQUENTIAL:
					m_vk.cmdDrawIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				case DRAW_TYPE_INDEXED:
					m_vk.cmdDrawIndexedIndirect(*m_cmdBuffer, m_indirectBuffer->object(), m_offsetInBuffer + drawNdx*m_strideInBuffer, 1u, 0u);
					break;
				default:
					TCU_FAIL("impossible");
			}
		}
	}
	m_vk.cmdEndRenderPass(*m_cmdBuffer);
	m_vk.endCommandBuffer(*m_cmdBuffer);

	vk::VkSubmitInfo submitInfo =
	{
		vk::VK_STRUCTURE_TYPE_SUBMIT_INFO,	// VkStructureType			sType;
		DE_NULL,							// const void*				pNext;
		0,										// deUint32					waitSemaphoreCount;
		DE_NULL,								// const VkSemaphore*		pWaitSemaphores;
		(const vk::VkPipelineStageFlags*)DE_NULL,
		1,										// deUint32					commandBufferCount;
		&m_cmdBuffer.get(),					// const VkCommandBuffer*	pCommandBuffers;
		0,										// deUint32					signalSemaphoreCount;
		DE_NULL								// const VkSemaphore*		pSignalSemaphores;
	};
	VK_CHECK(m_vk.queueSubmit(queue, 1, &submitInfo, DE_NULL));

	VK_CHECK(m_vk.queueWaitIdle(queue));

	// Validation
	VK_CHECK(m_vk.queueWaitIdle(queue));

	tcu::Texture2D referenceFrame(vk::mapVkFormat(m_colorAttachmentFormat), (int)(0.5 + WIDTH), (int)(0.5 + HEIGHT));

	referenceFrame.allocLevel(0);

	const deInt32 frameWidth	= referenceFrame.getWidth();
	const deInt32 frameHeight	= referenceFrame.getHeight();

	tcu::clear(referenceFrame.getLevel(0), tcu::Vec4(0.0f, 0.0f, 0.0f, 1.0f));

	ReferenceImageInstancedCoordinates refInstancedCoords;

	for (int y = 0; y < frameHeight; y++)
	{
		const float yCoord = (float)(y / (0.5*frameHeight)) - 1.0f;

		for (int x = 0; x < frameWidth; x++)
		{
			const float xCoord = (float)(x / (0.5*frameWidth)) - 1.0f;

			if ((yCoord >= refInstancedCoords.bottom	&&
				 yCoord <= refInstancedCoords.top		&&
				 xCoord >= refInstancedCoords.left		&&
				 xCoord <= refInstancedCoords.right))
				referenceFrame.getLevel(0).setPixel(tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f), x, y);
		}
	}

	const vk::VkOffset3D zeroOffset = { 0, 0, 0 };
	const tcu::ConstPixelBufferAccess renderedFrame = m_colorTargetImage->readSurface(queue, m_context.getDefaultAllocator(),
		vk::VK_IMAGE_LAYOUT_GENERAL, zeroOffset, WIDTH, HEIGHT, vk::VK_IMAGE_ASPECT_COLOR_BIT);

	qpTestResult res = QP_TEST_RESULT_PASS;

	if (!tcu::fuzzyCompare(log, "Result", "Image comparison result",
		referenceFrame.getLevel(0), renderedFrame, 0.05f,
		tcu::COMPARE_LOG_RESULT)) {
		res = QP_TEST_RESULT_FAIL;
	}

	return tcu::TestStatus(res, qpGetTestResultName(res));

	}